

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  void *in_RCX;
  uint64_t in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Opcode;
  undefined4 local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(in_ESI,0x1b,5);
  uVar3 = uVar1 | uVar2 << 4;
  if (uVar3 == 0xc) {
    MCInst_setOpcode(in_RDI,0xe7);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x1c) {
    MCInst_setOpcode(in_RDI,0xf4);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x2c) {
    MCInst_setOpcode(in_RDI,0x1d);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x3c) {
    MCInst_setOpcode(in_RDI,0x90);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x4c) {
    MCInst_setOpcode(in_RDI,0x89);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x5c) {
    MCInst_setOpcode(in_RDI,0x82);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x6c) {
    MCInst_setOpcode(in_RDI,0x81);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x7c) {
    MCInst_setOpcode(in_RDI,0xaf);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x8c) {
    MCInst_setOpcode(in_RDI,0x47);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x9c) {
    MCInst_setOpcode(in_RDI,0x48);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x10c) {
    MCInst_setOpcode(in_RDI,0xdb);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x11c) {
    MCInst_setOpcode(in_RDI,0xdc);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 300) {
    MCInst_setOpcode(in_RDI,0x1c);
    local_4 = DecodeL2RUSBitpInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x12d) {
    MCInst_setOpcode(in_RDI,0xb5);
    local_4 = DecodeL2RUSBitpInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x12e) {
    MCInst_setOpcode(in_RDI,0x71);
    local_4 = DecodeL2RUSBitpInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x13c) {
    MCInst_setOpcode(in_RDI,0x8f);
    local_4 = DecodeL2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x14c) {
    MCInst_setOpcode(in_RDI,0x88);
    local_4 = DecodeL2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x15c) {
    MCInst_setOpcode(in_RDI,0x43);
    local_4 = DecodeL3RSrcDstInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x18c) {
    MCInst_setOpcode(in_RDI,0xba);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else if (uVar3 == 0x19c) {
    MCInst_setOpcode(in_RDI,0xbb);
    local_4 = DecodeL3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	// Try and decode as a L3R / L2RUS instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 16, 4) |
		fieldFromInstruction_4(Insn, 27, 5) << 4;
	switch (Opcode) {
		case 0x0c:
			MCInst_setOpcode(Inst, XCore_STW_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x1c:
			MCInst_setOpcode(Inst, XCore_XOR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x2c:
			MCInst_setOpcode(Inst, XCore_ASHR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5c:
			MCInst_setOpcode(Inst, XCore_LDA16F_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6c:
			MCInst_setOpcode(Inst, XCore_LDA16B_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7c:
			MCInst_setOpcode(Inst, XCore_MUL_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8c:
			MCInst_setOpcode(Inst, XCore_DIVS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9c:
			MCInst_setOpcode(Inst, XCore_DIVU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10c:
			MCInst_setOpcode(Inst, XCore_ST16_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11c:
			MCInst_setOpcode(Inst, XCore_ST8_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12c:
			MCInst_setOpcode(Inst, XCore_ASHR_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12d:
			MCInst_setOpcode(Inst, XCore_OUTPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12e:
			MCInst_setOpcode(Inst, XCore_INPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x13c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x15c:
			MCInst_setOpcode(Inst, XCore_CRC_l3r);
			return DecodeL3RSrcDstInstruction(Inst, Insn, Address, Decoder);
		case 0x18c:
			MCInst_setOpcode(Inst, XCore_REMS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19c:
			MCInst_setOpcode(Inst, XCore_REMU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}